

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

ClassConfidenceThresholding *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ClassConfidenceThresholding>
          (Arena *arena)

{
  ClassConfidenceThresholding *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<CoreML::Specification::ClassConfidenceThresholding>(arena);
    return pCVar1;
  }
  pCVar1 = (ClassConfidenceThresholding *)operator_new(0x30);
  CoreML::Specification::ClassConfidenceThresholding::ClassConfidenceThresholding
            (pCVar1,(Arena *)0x0,false);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }